

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_exception_handler_test.cpp
# Opt level: O0

void __thiscall
StdExceptionCatcher_Tests::Test_that_std_exception_catcher_with_differnt_fail_code_types_works::
test_method(Test_that_std_exception_catcher_with_differnt_fail_code_types_works *this)

{
  GenericExceptionHandler<std::exception,_mittens::UnHandler<double>,_mittens::DefaultNoAction<std::exception>_>
  catcher_1;
  GenericExceptionHandler<std::exception,_mittens::UnHandler<bool>,_mittens::DefaultNoAction<std::exception>_>
  catcher;
  Test_that_std_exception_catcher_with_differnt_fail_code_types_works *this_local;
  
  mittens::std_exception_handler<bool>(false);
  throw_std_exception();
  mittens::std_exception_handler<double>(0.7);
  throw_std_exception();
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(Test_that_std_exception_catcher_with_differnt_fail_code_types_works)
{
   {
      auto catcher = std_exception_handler(false); // use bool fail code type

      try
      {
         throw_std_exception();
      }
      catch (...)
      {
         BOOST_CHECK_EQUAL(false, catcher.handleException());
      }
   }

   {
      auto catcher = std_exception_handler(0.7); // use float fail code type

      try
      {
         throw_std_exception();
      }
      catch (...)
      {
         BOOST_CHECK_EQUAL(0.7, catcher.handleException());
      }
   }
}